

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void refresh_stt_win(void)

{
  WINDOW *pWVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer ppVar7;
  pointer ppVar8;
  size_type sVar9;
  size_t sVar10;
  reference this;
  undefined8 uVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer ppVar14;
  undefined8 uVar15;
  char *pcVar16;
  reference pvVar17;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  ulong local_190;
  size_t j;
  iterator iStack_180;
  int cell_width;
  _Self local_178;
  iterator it_4;
  undefined1 local_168 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Self local_c8;
  _Self local_c0;
  iterator it_3;
  _Self local_98;
  _Self local_90;
  iterator it_2;
  size_t frame;
  _Self local_58;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  _Self local_20;
  _Self local_18;
  iterator it;
  size_t y;
  
  if ((stt_visible) && (uniforms != (Uniforms *)0x0)) {
    werase(stt_win);
    it._M_node = (_Base_ptr)(long)stt_y;
    if ((have_colors & 1U) != 0) {
      wattr_on(stt_win,0x100,0);
    }
    wborder(stt_win,0x7c,0x20,0x20,0x20,0x2b,0x2b,0x2b,0x2b);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
         ::begin(&uniforms->functions);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::end(&uniforms->functions);
      bVar3 = std::operator!=(&local_18,&local_20);
      if (!bVar3) break;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_18);
      if (((ppVar7->second).present & 1U) != 0) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_18);
        bVar3 = std::function::operator_cast_to_bool((function *)&(ppVar7->second).print);
        iVar2 = it;
        pWVar1 = stt_win;
        iVar6 = stt_x;
        if (bVar3) {
          it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
          ::operator->(&local_18);
          uVar15 = std::__cxx11::string::c_str();
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                   ::operator->(&local_18);
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          ::operator()(&local_40,&(ppVar7->second).print);
          uVar11 = std::__cxx11::string::c_str();
          mvwprintw(pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,"%23s  %s",uVar15,uVar11);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
      ::operator++(&local_18);
    }
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
         ::begin(&uniforms->sequences);
    while( true ) {
      frame = (size_t)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
                      ::end(&uniforms->sequences);
      bVar3 = std::operator!=(&local_58,(_Self *)&frame);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
               ::operator->(&local_58);
      sVar9 = std::vector<UniformData,_std::allocator<UniformData>_>::size(&ppVar8->second);
      if (sVar9 != 0) {
        sVar10 = Uniforms::getFrame(uniforms);
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
                 ::operator->(&local_58);
        sVar9 = std::vector<UniformData,_std::allocator<UniformData>_>::size(&ppVar8->second);
        iVar2 = it;
        pWVar1 = stt_win;
        iVar6 = stt_x;
        it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
        ::operator->(&local_58);
        uVar15 = std::__cxx11::string::c_str();
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
                 ::operator->(&local_58);
        this = std::vector<UniformData,_std::allocator<UniformData>_>::operator[]
                         (&ppVar8->second,sVar10 % sVar9);
        UniformData::print_abi_cxx11_((string *)&it_2,this);
        uVar11 = std::__cxx11::string::c_str();
        mvwprintw(pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,"%23s  %s",uVar15,uVar11);
        std::__cxx11::string::~string((string *)&it_2);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
      ::operator++(&local_58);
    }
    local_90._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
         ::begin(&(uniforms->super_Scene).textures);
    while( true ) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::end(&(uniforms->super_Scene).textures);
      bVar3 = std::operator!=(&local_90,&local_98);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      if (!bVar3) break;
      it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                ::operator->(&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_3,
                     &ppVar12->first,"Resolution");
      uVar15 = std::__cxx11::string::c_str();
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                ::operator->(&local_90);
      iVar5 = (*ppVar12->second->_vptr_Texture[0xc])();
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                ::operator->(&local_90);
      iVar4 = (*ppVar12->second->_vptr_Texture[0xd])();
      mvwprintw((double)iVar5,(double)iVar4,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,
                "%23s  %.1f,%.1f",uVar15);
      std::__cxx11::string::~string((string *)&it_3);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
      ::operator++(&local_90);
    }
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
         ::begin(&(uniforms->super_Scene).streams);
    while( true ) {
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
           ::end(&(uniforms->super_Scene).streams);
      bVar3 = std::operator!=(&local_c0,&local_c8);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      if (!bVar3) break;
      it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      std::operator+(&local_e8,&ppVar13->first,"CurrentFrame");
      uVar15 = std::__cxx11::string::c_str();
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      (*(ppVar13->second->super_Texture)._vptr_Texture[0x1d])();
      mvwprintw((double)extraout_XMM0_Da,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,"%23s  %.3f"
                ,uVar15);
      std::__cxx11::string::~string((string *)&local_e8);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      std::operator+(&local_108,&ppVar13->first,"TotalFrames");
      uVar15 = std::__cxx11::string::c_str();
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      (*(ppVar13->second->super_Texture)._vptr_Texture[0x1c])();
      mvwprintw((double)extraout_XMM0_Da_00,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,
                "%23s  %.3f",uVar15);
      std::__cxx11::string::~string((string *)&local_108);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      std::operator+(&local_128,&ppVar13->first,"Time");
      uVar15 = std::__cxx11::string::c_str();
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      (*(ppVar13->second->super_Texture)._vptr_Texture[0x1a])();
      mvwprintw((double)extraout_XMM0_Da_01,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,
                "%23s  %.3f",uVar15);
      std::__cxx11::string::~string((string *)&local_128);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      std::operator+(&local_148,&ppVar13->first,"Duration");
      uVar15 = std::__cxx11::string::c_str();
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      (*(ppVar13->second->super_Texture)._vptr_Texture[0x19])();
      mvwprintw((double)extraout_XMM0_Da_02,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,
                "%23s  %.3f",uVar15);
      std::__cxx11::string::~string((string *)&local_148);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     &ppVar13->first,"Fps");
      uVar15 = std::__cxx11::string::c_str();
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_c0);
      (*(ppVar13->second->super_Texture)._vptr_Texture[0x18])();
      mvwprintw((double)extraout_XMM0_Da_03,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,
                "%23s  %.3f",uVar15);
      std::__cxx11::string::~string((string *)local_168);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
      ::operator++(&local_c0);
    }
    if ((have_colors & 1U) != 0) {
      wattr_off(stt_win,0x100,0);
    }
    if ((have_colors & 1U) != 0) {
      wattr_on(stt_win,0x200,0);
    }
    uniforms_starts_at = (int)it._M_node;
    it_4._M_node._4_4_ = 0;
    local_178._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
         ::begin(&uniforms->data);
    while( true ) {
      iStack_180 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                   ::end(&uniforms->data);
      bVar3 = std::operator!=(&local_178,&stack0xfffffffffffffe80);
      if (!bVar3) break;
      ppVar14 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                ::operator->(&local_178);
      iVar2 = it;
      pWVar1 = stt_win;
      iVar6 = stt_x;
      if ((ppVar14->second).size < 5) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
        ::operator->(&local_178);
        uVar15 = std::__cxx11::string::c_str();
        mvwprintw(pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar6,"%23s",uVar15);
        iVar6 = stt_x;
        iVar5 = stt_width - stt_values_col;
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                  ::operator->(&local_178);
        iVar6 = iVar6 + (int)((ulong)(long)iVar5 / (ppVar14->second).size);
        if (it_4._M_node._4_4_ == mouse_at) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
          ::operator->(&local_178);
          pcVar16 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::string::operator=((string *)&mouse_at_key_abi_cxx11_,pcVar16);
          mouse_at_index = 0;
          if (stt_values_col + iVar6 < mouse_x) {
            mouse_at_index = (size_t)((mouse_x - stt_values_col) / iVar6);
          }
        }
        for (local_190 = 0;
            ppVar14 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                      ::operator->(&local_178), local_190 < (ppVar14->second).size && local_190 < 4;
            local_190 = local_190 + 1) {
          if (((it_4._M_node._4_4_ == mouse_at) && (local_190 == mouse_at_index)) &&
             ((have_colors & 1U) != 0)) {
            wattr_on(stt_win,0x200,0);
          }
          iVar2._M_node = it._M_node;
          pWVar1 = stt_win;
          iVar5 = stt_values_col + iVar6 * (int)local_190;
          ppVar14 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                    ::operator->(&local_178);
          pvVar17 = std::array<float,_4UL>::operator[](&(ppVar14->second).value,local_190);
          mvwprintw((double)*pvVar17,pWVar1,(ulong)iVar2._M_node & 0xffffffff,iVar5,"%.3f");
          if ((have_colors & 1U) != 0) {
            wattr_off(stt_win,0x200,0);
          }
        }
        it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
        it_4._M_node._4_4_ = it_4._M_node._4_4_ + 1;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
      ::operator++(&local_178);
    }
    if ((have_colors & 1U) != 0) {
      wattr_on(stt_win,0x200,0);
    }
    wrefresh(stt_win);
    refresh_cursor();
  }
  return;
}

Assistant:

void refresh_stt_win() {
    if (!stt_visible || uniforms == nullptr)
        return;

    werase(stt_win);

    size_t y = stt_y;

    if (have_colors) wattron(stt_win, COLOR_PAIR(1));
    wborder(stt_win, '|', ' ', ' ', ' ', '+', '+', '+', '+');
    // box(stt_win, 0, 0);
    // Print Native Uniforms (they carry functions) that are present on the shader
    for (UniformFunctionsMap::iterator it= uniforms->functions.begin(); it != uniforms->functions.end(); ++it)
        if (it->second.present && it->second.print)
            mvwprintw(stt_win, y++, stt_x, "%23s  %s", it->first.c_str(), it->second.print().c_str() );

    for (UniformSequenceMap::iterator it= uniforms->sequences.begin(); it != uniforms->sequences.end(); ++it) {
        if (it->second.size() > 0) {
            size_t frame = uniforms->getFrame() % it->second.size();
            mvwprintw(stt_win, y++, stt_x, "%23s  %s", it->first.c_str(), it->second[frame].print().c_str() );
        }
    }

    for (vera::TexturesMap::iterator it = uniforms->textures.begin(); it != uniforms->textures.end(); ++it)
        mvwprintw(stt_win, y++, stt_x, "%23s  %.1f,%.1f", (it->first + "Resolution").c_str(), (float)it->second->getWidth(), (float)it->second->getHeight());

    for (vera::TextureStreamsMap::iterator it = uniforms->streams.begin(); it != uniforms->streams.end(); ++it) {
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"CurrentFrame").c_str(), it->second->getCurrentFrame() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"TotalFrames").c_str(), it->second->getTotalFrames() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Time").c_str(), it->second->getTime() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Duration").c_str(), it->second->getDuration() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Fps").c_str(), it->second->getFps() );
    }
    if (have_colors) wattroff(stt_win, COLOR_PAIR(1));

    if (have_colors) wattron(stt_win, COLOR_PAIR(2));
    uniforms_starts_at = y;
    int i = 0;
    for (UniformDataMap::iterator it= uniforms->data.begin(); it != uniforms->data.end(); ++it) {
        if (it->second.size > 4)
            continue;

        mvwprintw(stt_win, y, stt_x, "%23s", it->first.c_str());
        int cell_width = stt_x + (stt_width - stt_values_col) / it->second.size;

        if (i == mouse_at) {
            mouse_at_key = it->first.c_str();
            mouse_at_index = 0;
            
            if (mouse_x > stt_values_col + cell_width)
                mouse_at_index = (mouse_x - stt_values_col) / cell_width;
        }

        for (size_t j = 0 ; j < it->second.size && j < 4; j++) {
            if (i == mouse_at && j == mouse_at_index)
                if (have_colors) wattron(stt_win, COLOR_PAIR(2));
            mvwprintw(stt_win, y, stt_values_col + cell_width * j, "%.3f",it->second.value[j]);
            if (have_colors) wattroff(stt_win, COLOR_PAIR(2));
        }
        y++;
        i++;
    }
    if (have_colors) wattron(stt_win, COLOR_PAIR(2));

    // if (y > stt_win_height) {
    //     stt_win_height = y + 1;
    //     wresize(stt_win, stt_win_height, stt_width );
    //     mvwin(stt_win, 0, COLS - stt_width );
    // }

    wrefresh(stt_win);
    refresh_cursor();
}